

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteDeltaFor
               (int *values,bool *validity,bitpacking_width_t width,int frame_of_reference,
               int delta_offset,int *original_values,idx_t count,void *data_ptr)

{
  int *piVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<int,_true,_int> *)data_ptr,iVar2 + 0xc);
  WriteMetaData((BitpackingCompressionState<int,_true,_int> *)data_ptr,DELTA_FOR);
  piVar1 = *(int **)((long)data_ptr + 0x40);
  *piVar1 = frame_of_reference;
  piVar1[1] = (int)CONCAT71(in_register_00000011,width);
  piVar1[2] = delta_offset;
  *(int **)((long)data_ptr + 0x40) = piVar1 + 3;
  BitpackingPrimitives::PackBuffer<int,false>((data_ptr_t)(piVar1 + 3),values,count,width);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}